

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall
testing::internal::anon_unknown_36::PositiveAndNegativeUnitTestFilter::MatchesTest
          (PositiveAndNegativeUnitTestFilter *this,string *test_suite_name,string *test_name)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  PositiveAndNegativeUnitTestFilter *this_00;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  this_00 = (PositiveAndNegativeUnitTestFilter *)&stack0xffffffffffffffa8;
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  bVar1 = MatchesName(this_00,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool MatchesTest(const std::string& test_suite_name,
                   const std::string& test_name) const {
    return MatchesName(test_suite_name + "." + test_name);
  }